

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memmove_s.c
# Opt level: O1

errno_t memmove_s(void *s1,rsize_t s1max,void *s2,rsize_t n)

{
  undefined1 uVar1;
  long lVar2;
  errno_t eVar3;
  undefined1 *puVar4;
  long lVar5;
  undefined1 *puVar6;
  bool bVar7;
  
  if ((((s1max < n) || (s1 == (void *)0x0)) || (s2 == (void *)0x0)) || ((long)(n | s1max) < 0)) {
    if (-1 < (long)s1max && s1 != (void *)0x0) {
      memset(s1,0,s1max);
    }
    (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
    eVar3 = 0x16;
  }
  else {
    eVar3 = 0;
    if (n != 0) {
      lVar2 = 1 - n;
      puVar4 = (undefined1 *)s2;
      puVar6 = (undefined1 *)s1;
      do {
        if ((puVar6 == (undefined1 *)s2) || (puVar4 == (undefined1 *)s1)) {
          lVar5 = 0;
          do {
            *(undefined1 *)((long)s1 + lVar5 + (n - 1)) =
                 *(undefined1 *)((long)s2 + lVar5 + (n - 1));
            bVar7 = lVar2 != lVar5;
            lVar5 = lVar5 + -1;
          } while (bVar7);
          return 0;
        }
        uVar1 = *puVar4;
        puVar4 = puVar4 + 1;
        *puVar6 = uVar1;
        puVar6 = puVar6 + 1;
        lVar2 = lVar2 + 1;
        eVar3 = 0;
      } while (lVar2 != 1);
    }
  }
  return eVar3;
}

Assistant:

errno_t memmove_s( void * s1, rsize_t s1max, const void * s2, rsize_t n )
{
    char * dest = ( char * ) s1;
    const char * src = ( const char * ) s2;

    if ( s1 == NULL || s2 == NULL || s1max > RSIZE_MAX || n > RSIZE_MAX || n > s1max )
    {
        if ( s1 != NULL && s1max <= RSIZE_MAX )
        {
            memset( s1, 0, s1max );
        }

        _PDCLIB_constraint_handler( _PDCLIB_CONSTRAINT_VIOLATION( _PDCLIB_EINVAL ) );
        return _PDCLIB_EINVAL;
    }

    while ( n )
    {
        if ( dest == s2 || src == s1 )
        {
            src += n;
            dest += n;

            while ( n-- )
            {
                *--dest = *--src;
            }

            return 0;
        }

        *dest++ = *src++;
        --n;
    }

    return 0;
}